

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
worker_thread<directed_flag_complex_in_memory_computer::reorder_edges_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,int number_of_threads,
          int thread_id,reorder_edges_t *f,int min_dimension,int max_dimension)

{
  pointer pdVar1;
  pointer pdVar2;
  uint uVar3;
  allocator_type local_4d;
  int local_4c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  
  pdVar1 = (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar2 = (this->vertex_cells).
           super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4c = min_dimension;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&prefix,(long)(max_dimension + 1),&local_4d);
  while (uVar3 = thread_id & 0xffff, uVar3 < ((uint)(((long)pdVar1 - (long)pdVar2) / 0x18) & 0xffff)
        ) {
    directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
              ((this->vertex_cells).
               super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3,f,local_4c,max_dimension,
               prefix.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    thread_id = uVar3 + number_of_threads;
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&prefix.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void worker_thread(int number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const vertex_index_t number_of_vertices = vertex_index_t(vertex_cells.size());

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		for (vertex_index_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
			vertex_cells[index].for_each_cell(f, min_dimension, max_dimension, prefix.data());
		}

		f.done();
	}